

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_flash_attn_ext
               (ggml_compute_params *params,ggml_tensor *q,ggml_tensor *k,ggml_tensor *v,
               ggml_tensor *mask,ggml_tensor *dst)

{
  void *pvVar1;
  undefined2 *puVar2;
  int *piVar3;
  uint *puVar4;
  size_t sVar5;
  size_t sVar6;
  ggml_from_float_t p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  byte bVar20;
  byte bVar21;
  uint uVar22;
  ggml_tensor *pgVar23;
  uint uVar24;
  size_t sVar25;
  size_t sVar26;
  ggml_type_traits_cpu *pgVar27;
  long lVar28;
  void *pvVar29;
  void *pvVar30;
  void *pvVar31;
  ulong uVar32;
  char *pcVar33;
  size_t __n;
  long lVar34;
  long lVar35;
  ulong uVar36;
  undefined8 uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  ggml_tensor *pgVar43;
  int iVar44;
  uint uVar45;
  long lVar46;
  ushort *puVar47;
  bool bVar48;
  ushort uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 extraout_var_03 [56];
  undefined1 auVar64 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar65 [64];
  undefined1 extraout_var_02 [60];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_04 [56];
  undefined1 auVar66 [64];
  undefined1 in_XMM9 [16];
  float local_2ac;
  void *local_2a8;
  long local_2a0;
  int64_t local_298;
  long local_290;
  size_t local_288;
  size_t local_280;
  undefined1 local_278 [16];
  int64_t local_260;
  ulong local_258;
  int local_24c;
  size_t local_248;
  long local_240;
  void *local_238;
  int64_t local_230;
  ggml_tensor *local_228;
  long local_220;
  void *local_218;
  code *local_210;
  uint local_204;
  ggml_tensor *local_200;
  long local_1f8;
  size_t local_1f0;
  ggml_compute_params *local_1e8;
  size_t local_1e0;
  long local_1d8;
  ggml_tensor *local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  size_t local_168;
  size_t local_160;
  size_t local_158;
  size_t local_150;
  long local_148;
  ggml_from_float_t local_140;
  long local_138;
  int64_t local_130;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  ggml_tensor *local_110;
  long local_108;
  ggml_tensor *local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  ggml_vec_dot_t local_c8;
  size_t local_c0;
  long local_b8;
  void *local_b0;
  undefined1 local_a8 [64];
  float local_68;
  float local_58;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_01 [60];
  
  local_1e8 = params;
  if (1 < (uint)dst->op_params[3]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1bb5,"fatal error");
  }
  lVar28 = v->ne[0];
  if (dst->ne[0] == lVar28) {
    local_1f8 = q->ne[1];
    local_108 = dst->ne[2];
    local_2a0 = lVar28;
    local_100 = mask;
    if (local_108 == local_1f8) {
      local_290 = q->ne[0];
      lVar28 = q->ne[2];
      lVar34 = q->ne[3];
      sVar26 = q->nb[0];
      local_118 = q->nb[1];
      local_120 = q->nb[2];
      local_128 = q->nb[3];
      local_230 = k->ne[0];
      local_260 = k->ne[1];
      local_2a8 = (void *)k->ne[2];
      local_a8._0_8_ = k->ne[3];
      sVar5 = k->nb[0];
      local_c0 = k->nb[1];
      local_150 = k->nb[2];
      local_158 = k->nb[3];
      lVar40 = v->ne[2];
      local_298 = v->ne[3];
      sVar6 = v->nb[0];
      local_288 = v->nb[1];
      local_160 = v->nb[2];
      local_168 = v->nb[3];
      local_130 = dst->ne[1];
      local_280 = dst->nb[0];
      local_1f0 = dst->nb[1];
      uVar36 = dst->nb[2];
      local_278._0_8_ = dst->nb[3];
      local_220 = (long)params->ith;
      local_258 = (ulong)(uint)params->nth;
      local_228 = v;
      local_200 = dst;
      local_110 = q;
      sVar25 = ggml_type_size(q->type);
      if (sVar26 == sVar25) {
        local_1d0 = k;
        sVar26 = ggml_type_size(k->type);
        if (sVar5 == sVar26) {
          sVar26 = ggml_type_size(local_228->type);
          local_148 = local_220;
          pgVar43 = local_228;
          auVar52._8_56_ = extraout_var_04;
          auVar52._0_8_ = extraout_XMM1_Qa;
          auVar62 = auVar52._0_16_;
          if (sVar6 == sVar26) {
            if (local_290 == local_230) {
              if (local_280 == 4) {
                if (local_1f0 < 4) {
                  pcVar33 = "nb0 <= nb1";
                  uVar37 = 0x1af2;
                }
                else if (uVar36 < local_1f0) {
                  pcVar33 = "nb1 <= nb2";
                  uVar37 = 0x1af3;
                }
                else if ((ulong)local_278._0_8_ < uVar36) {
                  pcVar33 = "nb2 <= nb3";
                  uVar37 = 0x1af4;
                }
                else {
                  local_170 = lVar28 / (long)local_2a8;
                  local_178 = lVar34 / (long)local_a8._0_8_;
                  local_180 = lVar28 / lVar40;
                  local_188 = lVar34 / local_298;
                  local_138 = lVar28 * local_1f8;
                  iVar44 = (int)lVar34 * (int)local_138;
                  local_24c = (iVar44 + -1 + (int)local_258) / (int)local_258;
                  iVar41 = local_24c * (int)local_220;
                  local_24c = local_24c + iVar41;
                  if (iVar44 <= local_24c) {
                    local_24c = iVar44;
                  }
                  local_1b8 = ZEXT416((uint)local_200->op_params[0]);
                  local_1c8 = ZEXT416((uint)local_200->op_params[1]);
                  local_258 = CONCAT44(local_258._4_4_,local_200->op_params[2]);
                  auVar50 = vcvtusi2sd_avx512f(auVar62,(int)lVar28);
                  auVar53._0_8_ = log2(auVar50._0_8_);
                  auVar53._8_56_ = extraout_var_03;
                  auVar50 = vroundsd_avx(auVar53._0_16_,auVar53._0_16_,9);
                  uVar24 = vcvttsd2usi_avx512f(auVar50);
                  local_204 = 1 << (uVar24 & 0x1f);
                  auVar50._8_4_ = 0x80000000;
                  auVar50._0_8_ = 0x8000000080000000;
                  auVar50._12_4_ = 0x80000000;
                  auVar50 = vxorps_avx512vl(local_1c8,auVar50);
                  auVar62 = vcvtusi2ss_avx512f(auVar62,local_204);
                  local_58 = exp2f(auVar50._0_4_ / auVar62._0_4_);
                  local_68 = exp2f(((float)local_1c8._0_4_ * -0.5) / auVar62._0_4_);
                  pgVar23 = local_1d0;
                  pgVar27 = ggml_get_type_traits_cpu(local_1d0->type);
                  pgVar27 = ggml_get_type_traits_cpu(pgVar27->vec_dot_type);
                  p_Var7 = pgVar27->from_float;
                  pgVar27 = ggml_get_type_traits_cpu(pgVar23->type);
                  local_c8 = pgVar27->vec_dot;
                  lVar28 = ggml_get_type_traits(pgVar43->type);
                  local_140 = p_Var7;
                  if (p_Var7 == (ggml_from_float_t)0x0) {
                    pcVar33 = "( q_to_vec_dot) && \"fattn: unsupported K-type\"";
                    uVar37 = 0x1b20;
                  }
                  else {
                    local_210 = *(code **)(lVar28 + 0x28);
                    if (local_210 != (code *)0x0 || pgVar43->type == GGML_TYPE_F32) {
                      if (iVar41 < local_24c) {
                        uVar37 = vcmpss_avx512f(ZEXT416((uint)(float)local_258),ZEXT816(0) << 0x40,4
                                               );
                        bVar48 = (bool)((byte)uVar37 & 1);
                        local_1b8._0_4_ =
                             (uint)bVar48 * (int)((float)local_1b8._0_4_ / (float)local_258) +
                             (uint)!bVar48 * local_1b8._0_4_;
                        local_1e0 = local_2a0 * 2;
                        local_248 = local_2a0 * 4;
                        local_148 = (local_230 + 0x10 + local_2a0 * 2) * local_148;
                        uVar24 = (uint)local_2a0 & 0xffffffc0;
                        uVar36 = (ulong)uVar24;
                        local_240 = (long)(int)uVar24;
                        local_1d8 = (long)(int)(uint)local_2a0;
                        local_e0 = (long)iVar41;
                        lVar28 = local_240 + 1;
                        if (local_240 + 1 <= local_1d8) {
                          lVar28 = local_1d8;
                        }
                        auVar52 = vpbroadcastq_avx512f();
                        local_a8 = vmovdqu64_avx512f(auVar52);
                        uVar38 = (lVar28 - local_240) + 0xfU & 0xfffffffffffffff0;
                        local_190 = local_240 * 4;
                        local_198 = local_248 + local_148 * 4 + local_240 * 4;
                        local_1a0 = local_240 * 2;
                        do {
                          lVar34 = (long)(int)(local_e0 / local_138);
                          lVar40 = local_e0 - lVar34 * local_138;
                          lVar28 = lVar40 % local_1f8;
                          local_220 = CONCAT44(local_220._4_4_,0x3f800000);
                          uVar45 = (uint)(lVar40 / local_1f8);
                          if (0.0 < (float)local_1c8._0_4_) {
                            bVar48 = uVar45 < local_204;
                            uVar22 = (uVar45 - local_204) * 2;
                            if (bVar48) {
                              uVar22 = uVar45;
                            }
                            auVar62 = vcvtusi2ss_avx512f(in_XMM9,uVar22 + 1);
                            fVar61 = powf((float)((uint)bVar48 * (int)local_58 +
                                                 (uint)!bVar48 * (int)local_68),auVar62._0_4_);
                            local_220 = CONCAT44(local_220._4_4_,fVar61);
                          }
                          local_218 = local_1e8->wdata;
                          pvVar31 = (void *)((long)local_218 + local_148 * 4);
                          pvVar1 = (void *)((long)pvVar31 + local_2a0 * 4);
                          __n = local_248;
                          pvVar30 = pvVar31;
                          if (pgVar43->type == GGML_TYPE_F16) {
                            __n = local_1e0;
                            pvVar30 = pvVar1;
                          }
                          memset(pvVar30,0,__n);
                          iVar41 = (int)lVar28;
                          if (local_100 == (ggml_tensor *)0x0) {
                            local_2a8 = (void *)0x0;
                          }
                          else {
                            local_2a8 = (void *)((long)iVar41 * local_100->nb[1] +
                                                (long)local_100->data);
                          }
                          lVar46 = (long)(int)uVar45;
                          local_b0 = (void *)((long)pvVar31 + local_1e0 * 4);
                          local_f0 = (long)iVar41;
                          (*local_140)((float *)((long)local_110->data +
                                                lVar46 * local_120 +
                                                lVar34 * local_128 + local_f0 * local_118),local_b0,
                                       local_230);
                          lVar28 = local_240;
                          lVar40 = local_2a0;
                          local_238 = pvVar31;
                          local_f8 = lVar46;
                          local_e8 = lVar34;
                          if (local_260 < 1) {
                            fVar61 = 0.0;
                            auVar52 = vmovdqu64_avx512f(local_a8);
                            auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                            auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                          }
                          else {
                            local_b8 = (long)(int)(lVar34 / local_178) * local_158 +
                                       (long)(int)(lVar46 / local_170) * local_150;
                            local_d0 = (long)(int)(lVar46 / local_180) * local_160;
                            local_d8 = (long)(int)(lVar34 / local_188) * local_168;
                            lVar34 = local_d8 + local_d0;
                            lVar46 = lVar34 + local_190;
                            local_218 = (void *)((long)local_218 + local_198);
                            lVar35 = local_1a0 + local_d8 + local_d0;
                            auVar66 = ZEXT864(0);
                            local_298 = CONCAT44(local_298._4_4_,0xff800000);
                            lVar42 = 0;
                            auVar52 = vmovdqu64_avx512f(local_a8);
                            auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                            auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                            pvVar30 = local_2a8;
                            lVar39 = local_260;
                            sVar26 = local_288;
                            do {
                              fVar61 = 0.0;
                              if (pvVar30 != (void *)0x0) {
                                fVar61 = (float)local_220 *
                                         *(float *)(&ggml_table_f32_f16 +
                                                   (ulong)*(ushort *)((long)pvVar30 + lVar42 * 2) *
                                                   4);
                              }
                              if (-INFINITY < fVar61) {
                                local_278._0_4_ = fVar61;
                                local_280 = CONCAT44(local_280._4_4_,auVar66._0_4_);
                                local_290 = lVar46;
                                (*local_c8)((int)local_230,&local_2ac,0,
                                            (void *)((long)local_1d0->data +
                                                    local_b8 + lVar42 * local_c0),0,local_b0,0,1);
                                local_2ac = (float)local_1b8._0_4_ * local_2ac;
                                if (((float)local_258 != 0.0) || (NAN((float)local_258))) {
                                  local_2ac = tanhf(local_2ac);
                                  local_2ac = local_2ac * (float)local_258;
                                }
                                local_2ac = (float)local_278._0_4_ + local_2ac;
                                pvVar30 = local_228->data;
                                if (local_228->type == GGML_TYPE_F16) {
                                  if (local_2ac <= (float)local_298) {
                                    auVar65._0_4_ = expf(local_2ac - (float)local_298);
                                    auVar65._4_60_ = extraout_var_01;
                                    auVar50 = auVar65._0_16_;
                                    auVar62 = SUB6416(ZEXT464(0x3f800000),0);
                                    auVar52 = vmovdqu64_avx512f(local_a8);
                                    auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                    auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                  }
                                  else {
                                    local_278._0_4_ = local_2ac;
                                    auVar64._0_4_ = expf((float)local_298 - local_2ac);
                                    auVar64._4_60_ = extraout_var;
                                    auVar62 = auVar64._0_16_;
                                    auVar52 = vmovdqu64_avx512f(local_a8);
                                    auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                    auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                    if (0 < (int)uVar24) {
                                      auVar66 = vbroadcastss_avx512f(auVar62);
                                      uVar32 = 0;
                                      pvVar29 = pvVar1;
                                      do {
                                        lVar40 = 0;
                                        do {
                                          auVar55 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                                                       ((long)pvVar29 + lVar40));
                                          auVar55 = vmulps_avx512f(auVar66,auVar55);
                                          puVar2 = (undefined2 *)((long)pvVar29 + lVar40);
                                          auVar51 = vcvtps2ph_avx512f(auVar55,0);
                                          *puVar2 = auVar51._0_2_;
                                          puVar2[1] = auVar51._2_2_;
                                          puVar2[2] = auVar51._4_2_;
                                          puVar2[3] = auVar51._6_2_;
                                          puVar2[4] = auVar51._8_2_;
                                          puVar2[5] = auVar51._10_2_;
                                          puVar2[6] = auVar51._12_2_;
                                          puVar2[7] = auVar51._14_2_;
                                          puVar2[8] = auVar51._16_2_;
                                          puVar2[9] = auVar51._18_2_;
                                          puVar2[10] = auVar51._20_2_;
                                          puVar2[0xb] = auVar51._22_2_;
                                          puVar2[0xc] = auVar51._24_2_;
                                          puVar2[0xd] = auVar51._26_2_;
                                          puVar2[0xe] = auVar51._28_2_;
                                          puVar2[0xf] = auVar51._30_2_;
                                          lVar40 = lVar40 + 0x20;
                                        } while (lVar40 != 0x80);
                                        uVar32 = uVar32 + 0x40;
                                        pvVar29 = (void *)((long)pvVar29 + 0x80);
                                      } while (uVar32 < uVar36);
                                    }
                                    lVar40 = local_240;
                                    if (uVar24 != (uint)local_2a0) {
                                      do {
                                        auVar50 = vcvtps2ph_f16c(ZEXT416((uint)(auVar64._0_4_ *
                                                                               *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)((long)pvVar1 + lVar40 * 2) * 4)
                                                  )),0);
                                        vpextrw_avx(auVar50,0);
                                        lVar40 = lVar40 + 1;
                                      } while (lVar40 < local_1d8);
                                    }
                                    local_298 = CONCAT44(local_298._4_4_,local_278._0_4_);
                                    auVar50 = SUB6416(ZEXT464(0x3f800000),0);
                                  }
                                  if (0 < (int)uVar24) {
                                    auVar66 = vbroadcastss_avx512f(auVar50);
                                    lVar40 = lVar34 + (long)pvVar30;
                                    uVar32 = 0;
                                    pvVar29 = pvVar1;
                                    do {
                                      lVar46 = 0;
                                      do {
                                        auVar55 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                                                     (lVar40 + lVar46));
                                        auVar56 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                                                     ((long)pvVar29 + lVar46));
                                        auVar55 = vfmadd231ps_avx512f(auVar56,auVar66,auVar55);
                                        puVar2 = (undefined2 *)((long)pvVar29 + lVar46);
                                        auVar51 = vcvtps2ph_avx512f(auVar55,0);
                                        *puVar2 = auVar51._0_2_;
                                        puVar2[1] = auVar51._2_2_;
                                        puVar2[2] = auVar51._4_2_;
                                        puVar2[3] = auVar51._6_2_;
                                        puVar2[4] = auVar51._8_2_;
                                        puVar2[5] = auVar51._10_2_;
                                        puVar2[6] = auVar51._12_2_;
                                        puVar2[7] = auVar51._14_2_;
                                        puVar2[8] = auVar51._16_2_;
                                        puVar2[9] = auVar51._18_2_;
                                        puVar2[10] = auVar51._20_2_;
                                        puVar2[0xb] = auVar51._22_2_;
                                        puVar2[0xc] = auVar51._24_2_;
                                        puVar2[0xd] = auVar51._26_2_;
                                        puVar2[0xe] = auVar51._28_2_;
                                        puVar2[0xf] = auVar51._30_2_;
                                        lVar46 = lVar46 + 0x20;
                                      } while (lVar46 != 0x80);
                                      uVar32 = uVar32 + 0x40;
                                      pvVar29 = (void *)((long)pvVar29 + 0x80);
                                      lVar40 = lVar40 + 0x80;
                                    } while (uVar32 < uVar36);
                                  }
                                  uVar45 = (uint)local_280;
                                  if (uVar24 != (uint)local_2a0) {
                                    puVar47 = (ushort *)((long)pvVar30 + lVar35);
                                    lVar40 = local_240;
                                    do {
                                      auVar63 = vfmadd213ss_fma(ZEXT416(*(uint *)(&
                                                  ggml_table_f32_f16 + (ulong)*puVar47 * 4)),auVar50
                                                  ,ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                    (ulong)*(ushort *)
                                                                            ((long)pvVar1 +
                                                                            lVar40 * 2) * 4)));
                                      auVar63 = vcvtps2ph_f16c(auVar63,0);
                                      vpextrw_avx(auVar63,0);
                                      lVar40 = lVar40 + 1;
                                      puVar47 = puVar47 + 1;
                                    } while (lVar40 < local_1d8);
                                  }
LAB_00144d82:
                                  auVar63 = ZEXT416(uVar45);
                                }
                                else {
                                  if (local_2ac <= (float)local_298) {
                                    auVar54._0_4_ = expf(local_2ac - (float)local_298);
                                    auVar54._4_60_ = extraout_var_02;
                                    auVar50 = auVar54._0_16_;
                                    auVar62 = SUB6416(ZEXT464(0x3f800000),0);
                                    auVar52 = vmovdqu64_avx512f(local_a8);
                                    auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                    auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                  }
                                  else {
                                    local_278._0_4_ = local_2ac;
                                    auVar66._0_4_ = expf((float)local_298 - local_2ac);
                                    auVar66._4_60_ = extraout_var_00;
                                    auVar62 = auVar66._0_16_;
                                    auVar52 = vmovdqu64_avx512f(local_a8);
                                    auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                    auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                    if (0 < (int)uVar24) {
                                      auVar66 = vbroadcastss_avx512f(auVar62);
                                      uVar32 = 0;
                                      pvVar29 = local_238;
                                      do {
                                        lVar40 = 0;
                                        do {
                                          auVar55 = vmulps_avx512f(auVar66,*(undefined1 (*) [64])
                                                                            ((long)pvVar29 + lVar40)
                                                                  );
                                          *(undefined1 (*) [64])((long)pvVar29 + lVar40) = auVar55;
                                          lVar40 = lVar40 + 0x40;
                                        } while (lVar40 != 0x100);
                                        uVar32 = uVar32 + 0x40;
                                        pvVar29 = (void *)((long)pvVar29 + 0x100);
                                      } while (uVar32 < uVar36);
                                    }
                                    if (uVar24 == (uint)local_2a0) {
                                      local_298 = CONCAT44(local_298._4_4_,local_278._0_4_);
                                      auVar50 = SUB6416(ZEXT464(0x3f800000),0);
                                    }
                                    else {
                                      auVar66 = vbroadcastss_avx512f(auVar62);
                                      uVar32 = 0;
                                      do {
                                        auVar55 = vpbroadcastq_avx512f();
                                        auVar56 = vporq_avx512f(auVar55,auVar53);
                                        auVar55 = vporq_avx512f(auVar55,auVar54);
                                        uVar37 = vpcmpuq_avx512f(auVar55,auVar52,2);
                                        bVar20 = (byte)uVar37;
                                        uVar37 = vpcmpuq_avx512f(auVar56,auVar52,2);
                                        bVar21 = (byte)uVar37;
                                        uVar49 = CONCAT11(bVar21,bVar20);
                                        piVar3 = (int *)((long)pvVar31 + uVar32 * 4 + lVar28 * 4);
                                        auVar55._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * piVar3[1];
                                        auVar55._0_4_ = (uint)(bVar20 & 1) * *piVar3;
                                        auVar55._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * piVar3[2];
                                        auVar55._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * piVar3[3]
                                        ;
                                        auVar55._16_4_ = (uint)((byte)(uVar49 >> 4) & 1) * piVar3[4]
                                        ;
                                        auVar55._20_4_ = (uint)((byte)(uVar49 >> 5) & 1) * piVar3[5]
                                        ;
                                        auVar55._24_4_ = (uint)((byte)(uVar49 >> 6) & 1) * piVar3[6]
                                        ;
                                        auVar55._28_4_ = (uint)((byte)(uVar49 >> 7) & 1) * piVar3[7]
                                        ;
                                        auVar55._32_4_ = (uint)(bVar21 & 1) * piVar3[8];
                                        auVar55._36_4_ = (uint)(bVar21 >> 1 & 1) * piVar3[9];
                                        auVar55._40_4_ = (uint)(bVar21 >> 2 & 1) * piVar3[10];
                                        auVar55._44_4_ = (uint)(bVar21 >> 3 & 1) * piVar3[0xb];
                                        auVar55._48_4_ = (uint)(bVar21 >> 4 & 1) * piVar3[0xc];
                                        auVar55._52_4_ = (uint)(bVar21 >> 5 & 1) * piVar3[0xd];
                                        auVar55._56_4_ = (uint)(bVar21 >> 6 & 1) * piVar3[0xe];
                                        auVar55._60_4_ = (uint)(bVar21 >> 7) * piVar3[0xf];
                                        auVar55 = vmulps_avx512f(auVar66,auVar55);
                                        puVar4 = (uint *)((long)pvVar31 + uVar32 * 4 + lVar28 * 4);
                                        bVar48 = (bool)((byte)(uVar49 >> 1) & 1);
                                        bVar8 = (bool)((byte)(uVar49 >> 2) & 1);
                                        bVar9 = (bool)((byte)(uVar49 >> 3) & 1);
                                        bVar10 = (bool)((byte)(uVar49 >> 4) & 1);
                                        bVar11 = (bool)((byte)(uVar49 >> 5) & 1);
                                        bVar12 = (bool)((byte)(uVar49 >> 6) & 1);
                                        bVar13 = (bool)((byte)(uVar49 >> 7) & 1);
                                        bVar14 = (bool)(bVar21 >> 1 & 1);
                                        bVar15 = (bool)(bVar21 >> 2 & 1);
                                        bVar16 = (bool)(bVar21 >> 3 & 1);
                                        bVar17 = (bool)(bVar21 >> 4 & 1);
                                        bVar18 = (bool)(bVar21 >> 5 & 1);
                                        bVar19 = (bool)(bVar21 >> 6 & 1);
                                        *puVar4 = (uint)(bVar20 & 1) * auVar55._0_4_ |
                                                  (uint)!(bool)(bVar20 & 1) * *puVar4;
                                        puVar4[1] = (uint)bVar48 * auVar55._4_4_ |
                                                    (uint)!bVar48 * puVar4[1];
                                        puVar4[2] = (uint)bVar8 * auVar55._8_4_ |
                                                    (uint)!bVar8 * puVar4[2];
                                        puVar4[3] = (uint)bVar9 * auVar55._12_4_ |
                                                    (uint)!bVar9 * puVar4[3];
                                        puVar4[4] = (uint)bVar10 * auVar55._16_4_ |
                                                    (uint)!bVar10 * puVar4[4];
                                        puVar4[5] = (uint)bVar11 * auVar55._20_4_ |
                                                    (uint)!bVar11 * puVar4[5];
                                        puVar4[6] = (uint)bVar12 * auVar55._24_4_ |
                                                    (uint)!bVar12 * puVar4[6];
                                        puVar4[7] = (uint)bVar13 * auVar55._28_4_ |
                                                    (uint)!bVar13 * puVar4[7];
                                        puVar4[8] = (uint)(bVar21 & 1) * auVar55._32_4_ |
                                                    (uint)!(bool)(bVar21 & 1) * puVar4[8];
                                        puVar4[9] = (uint)bVar14 * auVar55._36_4_ |
                                                    (uint)!bVar14 * puVar4[9];
                                        puVar4[10] = (uint)bVar15 * auVar55._40_4_ |
                                                     (uint)!bVar15 * puVar4[10];
                                        puVar4[0xb] = (uint)bVar16 * auVar55._44_4_ |
                                                      (uint)!bVar16 * puVar4[0xb];
                                        puVar4[0xc] = (uint)bVar17 * auVar55._48_4_ |
                                                      (uint)!bVar17 * puVar4[0xc];
                                        puVar4[0xd] = (uint)bVar18 * auVar55._52_4_ |
                                                      (uint)!bVar18 * puVar4[0xd];
                                        puVar4[0xe] = (uint)bVar19 * auVar55._56_4_ |
                                                      (uint)!bVar19 * puVar4[0xe];
                                        puVar4[0xf] = (uint)(bVar21 >> 7) * auVar55._60_4_ |
                                                      (uint)!(bool)(bVar21 >> 7) * puVar4[0xf];
                                        uVar32 = uVar32 + 0x10;
                                      } while (uVar38 != uVar32);
                                      local_298 = CONCAT44(local_298._4_4_,local_278._0_4_);
                                      auVar50 = SUB6416(ZEXT464(0x3f800000),0);
                                    }
                                  }
                                  if (local_210 == (code *)0x0) {
                                    auVar66 = vbroadcastss_avx512f(auVar50);
                                    if (0 < (int)uVar24) {
                                      lVar40 = lVar34 + (long)pvVar30;
                                      uVar32 = 0;
                                      pvVar29 = local_238;
                                      do {
                                        lVar46 = 0;
                                        do {
                                          auVar55 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                         (lVar40 + lVar46),auVar66,
                                                                        *(undefined1 (*) [64])
                                                                         ((long)pvVar29 + lVar46));
                                          *(undefined1 (*) [64])((long)pvVar29 + lVar46) = auVar55;
                                          lVar46 = lVar46 + 0x40;
                                        } while (lVar46 != 0x100);
                                        uVar32 = uVar32 + 0x40;
                                        pvVar29 = (void *)((long)pvVar29 + 0x100);
                                        lVar40 = lVar40 + 0x100;
                                      } while (uVar32 < uVar36);
                                    }
                                    uVar45 = (uint)local_280;
                                    if (uVar24 != (uint)local_2a0) {
                                      uVar32 = 0;
                                      do {
                                        auVar55 = vpbroadcastq_avx512f();
                                        auVar56 = vporq_avx512f(auVar55,auVar53);
                                        auVar55 = vporq_avx512f(auVar55,auVar54);
                                        uVar37 = vpcmpuq_avx512f(auVar55,auVar52,2);
                                        bVar20 = (byte)uVar37;
                                        uVar37 = vpcmpuq_avx512f(auVar56,auVar52,2);
                                        bVar21 = (byte)uVar37;
                                        uVar49 = CONCAT11(bVar21,bVar20);
                                        piVar3 = (int *)((long)pvVar30 + uVar32 * 4 + local_290);
                                        auVar56._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * piVar3[1];
                                        auVar56._0_4_ = (uint)(bVar20 & 1) * *piVar3;
                                        auVar56._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * piVar3[2];
                                        auVar56._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * piVar3[3]
                                        ;
                                        auVar56._16_4_ = (uint)((byte)(uVar49 >> 4) & 1) * piVar3[4]
                                        ;
                                        auVar56._20_4_ = (uint)((byte)(uVar49 >> 5) & 1) * piVar3[5]
                                        ;
                                        auVar56._24_4_ = (uint)((byte)(uVar49 >> 6) & 1) * piVar3[6]
                                        ;
                                        auVar56._28_4_ = (uint)((byte)(uVar49 >> 7) & 1) * piVar3[7]
                                        ;
                                        auVar56._32_4_ = (uint)(bVar21 & 1) * piVar3[8];
                                        auVar56._36_4_ = (uint)(bVar21 >> 1 & 1) * piVar3[9];
                                        auVar56._40_4_ = (uint)(bVar21 >> 2 & 1) * piVar3[10];
                                        auVar56._44_4_ = (uint)(bVar21 >> 3 & 1) * piVar3[0xb];
                                        auVar56._48_4_ = (uint)(bVar21 >> 4 & 1) * piVar3[0xc];
                                        auVar56._52_4_ = (uint)(bVar21 >> 5 & 1) * piVar3[0xd];
                                        auVar56._56_4_ = (uint)(bVar21 >> 6 & 1) * piVar3[0xe];
                                        auVar56._60_4_ = (uint)(bVar21 >> 7) * piVar3[0xf];
                                        piVar3 = (int *)((long)pvVar31 + uVar32 * 4 + lVar28 * 4);
                                        auVar59._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * piVar3[1];
                                        auVar59._0_4_ = (uint)(bVar20 & 1) * *piVar3;
                                        auVar59._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * piVar3[2];
                                        auVar59._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * piVar3[3]
                                        ;
                                        auVar59._16_4_ = (uint)((byte)(uVar49 >> 4) & 1) * piVar3[4]
                                        ;
                                        auVar59._20_4_ = (uint)((byte)(uVar49 >> 5) & 1) * piVar3[5]
                                        ;
                                        auVar59._24_4_ = (uint)((byte)(uVar49 >> 6) & 1) * piVar3[6]
                                        ;
                                        auVar59._28_4_ = (uint)((byte)(uVar49 >> 7) & 1) * piVar3[7]
                                        ;
                                        auVar59._32_4_ = (uint)(bVar21 & 1) * piVar3[8];
                                        auVar59._36_4_ = (uint)(bVar21 >> 1 & 1) * piVar3[9];
                                        auVar59._40_4_ = (uint)(bVar21 >> 2 & 1) * piVar3[10];
                                        auVar59._44_4_ = (uint)(bVar21 >> 3 & 1) * piVar3[0xb];
                                        auVar59._48_4_ = (uint)(bVar21 >> 4 & 1) * piVar3[0xc];
                                        auVar59._52_4_ = (uint)(bVar21 >> 5 & 1) * piVar3[0xd];
                                        auVar59._56_4_ = (uint)(bVar21 >> 6 & 1) * piVar3[0xe];
                                        auVar59._60_4_ = (uint)(bVar21 >> 7) * piVar3[0xf];
                                        auVar55 = vfmadd231ps_avx512f(auVar59,auVar66,auVar56);
                                        puVar4 = (uint *)((long)pvVar31 + uVar32 * 4 + lVar28 * 4);
                                        bVar48 = (bool)((byte)(uVar49 >> 1) & 1);
                                        bVar8 = (bool)((byte)(uVar49 >> 2) & 1);
                                        bVar9 = (bool)((byte)(uVar49 >> 3) & 1);
                                        bVar10 = (bool)((byte)(uVar49 >> 4) & 1);
                                        bVar11 = (bool)((byte)(uVar49 >> 5) & 1);
                                        bVar12 = (bool)((byte)(uVar49 >> 6) & 1);
                                        bVar13 = (bool)((byte)(uVar49 >> 7) & 1);
                                        bVar14 = (bool)(bVar21 >> 1 & 1);
                                        bVar15 = (bool)(bVar21 >> 2 & 1);
                                        bVar16 = (bool)(bVar21 >> 3 & 1);
                                        bVar17 = (bool)(bVar21 >> 4 & 1);
                                        bVar18 = (bool)(bVar21 >> 5 & 1);
                                        bVar19 = (bool)(bVar21 >> 6 & 1);
                                        *puVar4 = (uint)(bVar20 & 1) * auVar55._0_4_ |
                                                  (uint)!(bool)(bVar20 & 1) * *puVar4;
                                        puVar4[1] = (uint)bVar48 * auVar55._4_4_ |
                                                    (uint)!bVar48 * puVar4[1];
                                        puVar4[2] = (uint)bVar8 * auVar55._8_4_ |
                                                    (uint)!bVar8 * puVar4[2];
                                        puVar4[3] = (uint)bVar9 * auVar55._12_4_ |
                                                    (uint)!bVar9 * puVar4[3];
                                        puVar4[4] = (uint)bVar10 * auVar55._16_4_ |
                                                    (uint)!bVar10 * puVar4[4];
                                        puVar4[5] = (uint)bVar11 * auVar55._20_4_ |
                                                    (uint)!bVar11 * puVar4[5];
                                        puVar4[6] = (uint)bVar12 * auVar55._24_4_ |
                                                    (uint)!bVar12 * puVar4[6];
                                        puVar4[7] = (uint)bVar13 * auVar55._28_4_ |
                                                    (uint)!bVar13 * puVar4[7];
                                        puVar4[8] = (uint)(bVar21 & 1) * auVar55._32_4_ |
                                                    (uint)!(bool)(bVar21 & 1) * puVar4[8];
                                        puVar4[9] = (uint)bVar14 * auVar55._36_4_ |
                                                    (uint)!bVar14 * puVar4[9];
                                        puVar4[10] = (uint)bVar15 * auVar55._40_4_ |
                                                     (uint)!bVar15 * puVar4[10];
                                        puVar4[0xb] = (uint)bVar16 * auVar55._44_4_ |
                                                      (uint)!bVar16 * puVar4[0xb];
                                        puVar4[0xc] = (uint)bVar17 * auVar55._48_4_ |
                                                      (uint)!bVar17 * puVar4[0xc];
                                        puVar4[0xd] = (uint)bVar18 * auVar55._52_4_ |
                                                      (uint)!bVar18 * puVar4[0xd];
                                        puVar4[0xe] = (uint)bVar19 * auVar55._56_4_ |
                                                      (uint)!bVar19 * puVar4[0xe];
                                        puVar4[0xf] = (uint)(bVar21 >> 7) * auVar55._60_4_ |
                                                      (uint)!(bool)(bVar21 >> 7) * puVar4[0xf];
                                        uVar32 = uVar32 + 0x10;
                                      } while (uVar38 != uVar32);
                                    }
                                    goto LAB_00144d82;
                                  }
                                  local_278 = auVar62;
                                  local_48 = auVar50;
                                  (*local_210)((long)pvVar30 +
                                               lVar42 * local_288 + local_d0 + local_d8);
                                  auVar54 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                  auVar53 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                  auVar52 = vmovdqu64_avx512f(local_a8);
                                  auVar66 = vbroadcastss_avx512f(local_48);
                                  auVar63 = ZEXT416((uint)local_280);
                                  if (0 < (int)uVar24) {
                                    uVar32 = 0;
                                    pvVar30 = local_238;
                                    do {
                                      lVar40 = 0;
                                      do {
                                        auVar55 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                       ((long)pvVar30 +
                                                                       lVar40 + local_248),auVar66,
                                                                      *(undefined1 (*) [64])
                                                                       ((long)pvVar30 + lVar40));
                                        *(undefined1 (*) [64])((long)pvVar30 + lVar40) = auVar55;
                                        lVar40 = lVar40 + 0x40;
                                      } while (lVar40 != 0x100);
                                      uVar32 = uVar32 + 0x40;
                                      pvVar30 = (void *)((long)pvVar30 + 0x100);
                                    } while (uVar32 < uVar36);
                                  }
                                  auVar62 = local_278;
                                  auVar50 = local_48;
                                  if (uVar24 != (uint)local_2a0) {
                                    uVar32 = 0;
                                    do {
                                      auVar55 = vpbroadcastq_avx512f();
                                      auVar56 = vporq_avx512f(auVar55,auVar53);
                                      auVar55 = vporq_avx512f(auVar55,auVar54);
                                      uVar37 = vpcmpuq_avx512f(auVar55,auVar52,2);
                                      bVar20 = (byte)uVar37;
                                      uVar37 = vpcmpuq_avx512f(auVar56,auVar52,2);
                                      bVar21 = (byte)uVar37;
                                      uVar49 = CONCAT11(bVar21,bVar20);
                                      piVar3 = (int *)((long)local_218 + uVar32 * 4);
                                      auVar57._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * piVar3[1];
                                      auVar57._0_4_ = (uint)(bVar20 & 1) * *piVar3;
                                      auVar57._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * piVar3[2];
                                      auVar57._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * piVar3[3];
                                      auVar57._16_4_ = (uint)((byte)(uVar49 >> 4) & 1) * piVar3[4];
                                      auVar57._20_4_ = (uint)((byte)(uVar49 >> 5) & 1) * piVar3[5];
                                      auVar57._24_4_ = (uint)((byte)(uVar49 >> 6) & 1) * piVar3[6];
                                      auVar57._28_4_ = (uint)((byte)(uVar49 >> 7) & 1) * piVar3[7];
                                      auVar57._32_4_ = (uint)(bVar21 & 1) * piVar3[8];
                                      auVar57._36_4_ = (uint)(bVar21 >> 1 & 1) * piVar3[9];
                                      auVar57._40_4_ = (uint)(bVar21 >> 2 & 1) * piVar3[10];
                                      auVar57._44_4_ = (uint)(bVar21 >> 3 & 1) * piVar3[0xb];
                                      auVar57._48_4_ = (uint)(bVar21 >> 4 & 1) * piVar3[0xc];
                                      auVar57._52_4_ = (uint)(bVar21 >> 5 & 1) * piVar3[0xd];
                                      auVar57._56_4_ = (uint)(bVar21 >> 6 & 1) * piVar3[0xe];
                                      auVar57._60_4_ = (uint)(bVar21 >> 7) * piVar3[0xf];
                                      piVar3 = (int *)((long)pvVar31 + uVar32 * 4 + lVar28 * 4);
                                      auVar58._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * piVar3[1];
                                      auVar58._0_4_ = (uint)(bVar20 & 1) * *piVar3;
                                      auVar58._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * piVar3[2];
                                      auVar58._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * piVar3[3];
                                      auVar58._16_4_ = (uint)((byte)(uVar49 >> 4) & 1) * piVar3[4];
                                      auVar58._20_4_ = (uint)((byte)(uVar49 >> 5) & 1) * piVar3[5];
                                      auVar58._24_4_ = (uint)((byte)(uVar49 >> 6) & 1) * piVar3[6];
                                      auVar58._28_4_ = (uint)((byte)(uVar49 >> 7) & 1) * piVar3[7];
                                      auVar58._32_4_ = (uint)(bVar21 & 1) * piVar3[8];
                                      auVar58._36_4_ = (uint)(bVar21 >> 1 & 1) * piVar3[9];
                                      auVar58._40_4_ = (uint)(bVar21 >> 2 & 1) * piVar3[10];
                                      auVar58._44_4_ = (uint)(bVar21 >> 3 & 1) * piVar3[0xb];
                                      auVar58._48_4_ = (uint)(bVar21 >> 4 & 1) * piVar3[0xc];
                                      auVar58._52_4_ = (uint)(bVar21 >> 5 & 1) * piVar3[0xd];
                                      auVar58._56_4_ = (uint)(bVar21 >> 6 & 1) * piVar3[0xe];
                                      auVar58._60_4_ = (uint)(bVar21 >> 7) * piVar3[0xf];
                                      auVar55 = vfmadd231ps_avx512f(auVar58,auVar66,auVar57);
                                      puVar4 = (uint *)((long)pvVar31 + uVar32 * 4 + lVar28 * 4);
                                      bVar48 = (bool)((byte)(uVar49 >> 1) & 1);
                                      bVar8 = (bool)((byte)(uVar49 >> 2) & 1);
                                      bVar9 = (bool)((byte)(uVar49 >> 3) & 1);
                                      bVar10 = (bool)((byte)(uVar49 >> 4) & 1);
                                      bVar11 = (bool)((byte)(uVar49 >> 5) & 1);
                                      bVar12 = (bool)((byte)(uVar49 >> 6) & 1);
                                      bVar13 = (bool)((byte)(uVar49 >> 7) & 1);
                                      bVar14 = (bool)(bVar21 >> 1 & 1);
                                      bVar15 = (bool)(bVar21 >> 2 & 1);
                                      bVar16 = (bool)(bVar21 >> 3 & 1);
                                      bVar17 = (bool)(bVar21 >> 4 & 1);
                                      bVar18 = (bool)(bVar21 >> 5 & 1);
                                      bVar19 = (bool)(bVar21 >> 6 & 1);
                                      *puVar4 = (uint)(bVar20 & 1) * auVar55._0_4_ |
                                                (uint)!(bool)(bVar20 & 1) * *puVar4;
                                      puVar4[1] = (uint)bVar48 * auVar55._4_4_ |
                                                  (uint)!bVar48 * puVar4[1];
                                      puVar4[2] = (uint)bVar8 * auVar55._8_4_ |
                                                  (uint)!bVar8 * puVar4[2];
                                      puVar4[3] = (uint)bVar9 * auVar55._12_4_ |
                                                  (uint)!bVar9 * puVar4[3];
                                      puVar4[4] = (uint)bVar10 * auVar55._16_4_ |
                                                  (uint)!bVar10 * puVar4[4];
                                      puVar4[5] = (uint)bVar11 * auVar55._20_4_ |
                                                  (uint)!bVar11 * puVar4[5];
                                      puVar4[6] = (uint)bVar12 * auVar55._24_4_ |
                                                  (uint)!bVar12 * puVar4[6];
                                      puVar4[7] = (uint)bVar13 * auVar55._28_4_ |
                                                  (uint)!bVar13 * puVar4[7];
                                      puVar4[8] = (uint)(bVar21 & 1) * auVar55._32_4_ |
                                                  (uint)!(bool)(bVar21 & 1) * puVar4[8];
                                      puVar4[9] = (uint)bVar14 * auVar55._36_4_ |
                                                  (uint)!bVar14 * puVar4[9];
                                      puVar4[10] = (uint)bVar15 * auVar55._40_4_ |
                                                   (uint)!bVar15 * puVar4[10];
                                      puVar4[0xb] = (uint)bVar16 * auVar55._44_4_ |
                                                    (uint)!bVar16 * puVar4[0xb];
                                      puVar4[0xc] = (uint)bVar17 * auVar55._48_4_ |
                                                    (uint)!bVar17 * puVar4[0xc];
                                      puVar4[0xd] = (uint)bVar18 * auVar55._52_4_ |
                                                    (uint)!bVar18 * puVar4[0xd];
                                      puVar4[0xe] = (uint)bVar19 * auVar55._56_4_ |
                                                    (uint)!bVar19 * puVar4[0xe];
                                      puVar4[0xf] = (uint)(bVar21 >> 7) * auVar55._60_4_ |
                                                    (uint)!(bool)(bVar21 >> 7) * puVar4[0xf];
                                      uVar32 = uVar32 + 0x10;
                                    } while (uVar38 != uVar32);
                                  }
                                }
                                auVar62 = vfmadd213ss_fma(auVar62,auVar63,auVar50);
                                auVar66 = ZEXT1664(auVar62);
                                lVar40 = local_2a0;
                                pvVar30 = local_2a8;
                                lVar39 = local_260;
                                sVar26 = local_288;
                                lVar46 = local_290;
                              }
                              fVar61 = auVar66._0_4_;
                              lVar42 = lVar42 + 1;
                              lVar34 = lVar34 + sVar26;
                              lVar46 = lVar46 + sVar26;
                              lVar35 = lVar35 + sVar26;
                            } while (lVar42 != lVar39);
                          }
                          pgVar43 = local_228;
                          if ((0 < lVar40) && (local_228->type == GGML_TYPE_F16)) {
                            lVar28 = 0;
                            do {
                              *(undefined4 *)((long)local_238 + lVar28 * 4) =
                                   *(undefined4 *)
                                    (&ggml_table_f32_f16 +
                                    (ulong)*(ushort *)((long)local_238 + lVar28 * 2 + local_248) * 4
                                    );
                              lVar28 = lVar28 + 1;
                            } while (lVar40 != lVar28);
                          }
                          auVar62._0_4_ = 1.0 / fVar61;
                          auVar62._4_12_ = SUB6012((undefined1  [60])0x0,0);
                          auVar66 = vbroadcastss_avx512f(auVar62);
                          if (0 < (int)uVar24) {
                            uVar32 = 0;
                            pvVar31 = local_238;
                            do {
                              lVar28 = 0;
                              do {
                                auVar55 = vmulps_avx512f(auVar66,*(undefined1 (*) [64])
                                                                  ((long)pvVar31 + lVar28));
                                *(undefined1 (*) [64])((long)pvVar31 + lVar28) = auVar55;
                                lVar28 = lVar28 + 0x40;
                              } while (lVar28 != 0x100);
                              uVar32 = uVar32 + 0x40;
                              pvVar31 = (void *)((long)pvVar31 + 0x100);
                            } while (uVar32 < uVar36);
                          }
                          if (uVar24 != (uint)lVar40) {
                            uVar32 = 0;
                            do {
                              auVar55 = vpbroadcastq_avx512f();
                              auVar56 = vporq_avx512f(auVar55,auVar53);
                              auVar55 = vporq_avx512f(auVar55,auVar54);
                              uVar37 = vpcmpuq_avx512f(auVar55,auVar52,2);
                              bVar20 = (byte)uVar37;
                              uVar37 = vpcmpuq_avx512f(auVar56,auVar52,2);
                              bVar21 = (byte)uVar37;
                              uVar49 = CONCAT11(bVar21,bVar20);
                              piVar3 = (int *)((long)local_238 + uVar32 * 4 + local_240 * 4);
                              auVar60._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * piVar3[1];
                              auVar60._0_4_ = (uint)(bVar20 & 1) * *piVar3;
                              auVar60._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * piVar3[2];
                              auVar60._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * piVar3[3];
                              auVar60._16_4_ = (uint)((byte)(uVar49 >> 4) & 1) * piVar3[4];
                              auVar60._20_4_ = (uint)((byte)(uVar49 >> 5) & 1) * piVar3[5];
                              auVar60._24_4_ = (uint)((byte)(uVar49 >> 6) & 1) * piVar3[6];
                              auVar60._28_4_ = (uint)((byte)(uVar49 >> 7) & 1) * piVar3[7];
                              auVar60._32_4_ = (uint)(bVar21 & 1) * piVar3[8];
                              auVar60._36_4_ = (uint)(bVar21 >> 1 & 1) * piVar3[9];
                              auVar60._40_4_ = (uint)(bVar21 >> 2 & 1) * piVar3[10];
                              auVar60._44_4_ = (uint)(bVar21 >> 3 & 1) * piVar3[0xb];
                              auVar60._48_4_ = (uint)(bVar21 >> 4 & 1) * piVar3[0xc];
                              auVar60._52_4_ = (uint)(bVar21 >> 5 & 1) * piVar3[0xd];
                              auVar60._56_4_ = (uint)(bVar21 >> 6 & 1) * piVar3[0xe];
                              auVar60._60_4_ = (uint)(bVar21 >> 7) * piVar3[0xf];
                              auVar55 = vmulps_avx512f(auVar66,auVar60);
                              puVar4 = (uint *)((long)local_238 + uVar32 * 4 + local_240 * 4);
                              bVar48 = (bool)((byte)(uVar49 >> 1) & 1);
                              bVar8 = (bool)((byte)(uVar49 >> 2) & 1);
                              bVar9 = (bool)((byte)(uVar49 >> 3) & 1);
                              bVar10 = (bool)((byte)(uVar49 >> 4) & 1);
                              bVar11 = (bool)((byte)(uVar49 >> 5) & 1);
                              bVar12 = (bool)((byte)(uVar49 >> 6) & 1);
                              bVar13 = (bool)((byte)(uVar49 >> 7) & 1);
                              bVar14 = (bool)(bVar21 >> 1 & 1);
                              bVar15 = (bool)(bVar21 >> 2 & 1);
                              bVar16 = (bool)(bVar21 >> 3 & 1);
                              bVar17 = (bool)(bVar21 >> 4 & 1);
                              bVar18 = (bool)(bVar21 >> 5 & 1);
                              bVar19 = (bool)(bVar21 >> 6 & 1);
                              *puVar4 = (uint)(bVar20 & 1) * auVar55._0_4_ |
                                        (uint)!(bool)(bVar20 & 1) * *puVar4;
                              puVar4[1] = (uint)bVar48 * auVar55._4_4_ | (uint)!bVar48 * puVar4[1];
                              puVar4[2] = (uint)bVar8 * auVar55._8_4_ | (uint)!bVar8 * puVar4[2];
                              puVar4[3] = (uint)bVar9 * auVar55._12_4_ | (uint)!bVar9 * puVar4[3];
                              puVar4[4] = (uint)bVar10 * auVar55._16_4_ | (uint)!bVar10 * puVar4[4];
                              puVar4[5] = (uint)bVar11 * auVar55._20_4_ | (uint)!bVar11 * puVar4[5];
                              puVar4[6] = (uint)bVar12 * auVar55._24_4_ | (uint)!bVar12 * puVar4[6];
                              puVar4[7] = (uint)bVar13 * auVar55._28_4_ | (uint)!bVar13 * puVar4[7];
                              puVar4[8] = (uint)(bVar21 & 1) * auVar55._32_4_ |
                                          (uint)!(bool)(bVar21 & 1) * puVar4[8];
                              puVar4[9] = (uint)bVar14 * auVar55._36_4_ | (uint)!bVar14 * puVar4[9];
                              puVar4[10] = (uint)bVar15 * auVar55._40_4_ |
                                           (uint)!bVar15 * puVar4[10];
                              puVar4[0xb] = (uint)bVar16 * auVar55._44_4_ |
                                            (uint)!bVar16 * puVar4[0xb];
                              puVar4[0xc] = (uint)bVar17 * auVar55._48_4_ |
                                            (uint)!bVar17 * puVar4[0xc];
                              puVar4[0xd] = (uint)bVar18 * auVar55._52_4_ |
                                            (uint)!bVar18 * puVar4[0xd];
                              puVar4[0xe] = (uint)bVar19 * auVar55._56_4_ |
                                            (uint)!bVar19 * puVar4[0xe];
                              puVar4[0xf] = (uint)(bVar21 >> 7) * auVar55._60_4_ |
                                            (uint)!(bool)(bVar21 >> 7) * puVar4[0xf];
                              uVar32 = uVar32 + 0x10;
                            } while (uVar38 != uVar32);
                          }
                          memcpy((void *)(((local_f0 + local_e8 * local_108) * local_130 + local_f8)
                                          * local_1f0 + (long)local_200->data),local_238,local_1f0);
                          local_e0 = local_e0 + 1;
                        } while (local_24c != (int)local_e0);
                      }
                      return;
                    }
                    pcVar33 = 
                    "(v->type == GGML_TYPE_F32 || v_to_float ) && \"fattn: unsupported V-type\"";
                    uVar37 = 0x1b21;
                  }
                }
              }
              else {
                pcVar33 = "nb0 == sizeof(float)";
                uVar37 = 0x1af1;
              }
            }
            else {
              pcVar33 = "neq0 == DK";
              uVar37 = 0x1aea;
            }
          }
          else {
            pcVar33 = "nbv0 == ggml_type_size(v->type)";
            uVar37 = 0x1ae8;
          }
        }
        else {
          pcVar33 = "nbk0 == ggml_type_size(k->type)";
          uVar37 = 0x1ae7;
        }
      }
      else {
        pcVar33 = "nbq0 == ggml_type_size(q->type)";
        uVar37 = 0x1ae6;
      }
    }
    else {
      pcVar33 = "ne2 == N";
      uVar37 = 0x1ae3;
    }
  }
  else {
    pcVar33 = "ne0 == DV";
    uVar37 = 0x1ae2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar37,"GGML_ASSERT(%s) failed",pcVar33);
}

Assistant:

void ggml_compute_forward_flash_attn_ext(
        const ggml_compute_params * params,
        const ggml_tensor * q,
        const ggml_tensor * k,
        const ggml_tensor * v,
        const ggml_tensor * mask,
        ggml_tensor * dst) {
    switch (dst->op_params[3]) {
        case GGML_PREC_DEFAULT:
        case GGML_PREC_F32:
            {
                // uses F32 accumulators
                ggml_compute_forward_flash_attn_ext_f16(params, q, k, v, mask, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}